

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O1

void __thiscall
embree::collide2::CollisionConstraint::solvePositionConstraint
          (CollisionConstraint *this,ClothModel *model,float timeStep,size_t iter)

{
  pointer pVVar1;
  float fVar2;
  size_t sVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  pointer pVVar10;
  float fVar11;
  
  sVar3 = *(this->super_Constraint).bodyIDs_;
  fVar2 = (model->m_inv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[sVar3];
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    pVVar10 = (model->super_Mesh).x_.
              super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar1 = pVVar10 + sVar3;
    fVar2 = (pVVar1->field_0).m128[1];
    fVar4 = (pVVar1->field_0).m128[2];
    fVar5 = (pVVar1->field_0).m128[3];
    fVar6 = (this->n_).field_0.m128[0];
    fVar7 = (this->n_).field_0.m128[1];
    fVar8 = (this->n_).field_0.m128[2];
    fVar9 = (this->n_).field_0.m128[3];
    fVar11 = ((fVar4 - (this->x0_).field_0.m128[2]) * fVar8 +
             (fVar2 - (this->x0_).field_0.m128[1]) * fVar7 +
             ((pVVar1->field_0).m128[0] - (this->x0_).field_0.m128[0]) * fVar6) - this->d_;
    if (fVar11 < -this->d_) {
      pVVar10 = pVVar10 + sVar3;
      (pVVar10->field_0).m128[0] = (pVVar1->field_0).m128[0] - fVar6 * fVar11;
      (pVVar10->field_0).m128[1] = fVar2 - fVar7 * fVar11;
      (pVVar10->field_0).m128[2] = fVar4 - fVar8 * fVar11;
      (pVVar10->field_0).m128[3] = fVar5 - fVar9 * fVar11;
      return;
    }
  }
  return;
}

Assistant:

void CollisionConstraint::solvePositionConstraint (ClothModel & model, float timeStep, size_t iter) {

    if (0.f == model.m_inv_[bodyIDs_[0]]) {
        return;
    }

    auto & q = model.x_[bodyIDs_[0]];
    float proj = dot (q-x0_, n_) - d_;//(q.x - x0_.x) * n_.x + (q.y - x0_.y) * n_.y + (q.z - x0_.z) * n_.z - d_;
    if (proj < -d_) {
        q += -n_*proj;
    }
}